

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexes.c
# Opt level: O1

int * compute_cells(int *dims,int *ncells)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int *piVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int *piVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  
  lVar6 = ((long)dims[2] + -1) * ((long)dims[1] + -1) * ((long)*dims + -1);
  *ncells = (int)lVar6;
  piVar7 = (int *)malloc(lVar6 * 0x18);
  iVar3 = dims[2];
  if (1 < iVar3) {
    iVar4 = *dims;
    iVar1 = dims[1] + -1;
    iVar9 = ((iVar3 + -1) * dims[1] + iVar1 * iVar3) * (iVar4 + -1);
    iVar10 = 0;
    iVar5 = 1;
    piVar12 = piVar7;
    do {
      if (1 < dims[1]) {
        iVar13 = 0;
        iVar8 = 1;
        do {
          iVar16 = *dims;
          if (1 < iVar16) {
            iVar2 = iVar16 + -1;
            iVar18 = 0;
            do {
              iVar17 = iVar10 * dims[1];
              iVar11 = iVar1 * (iVar4 + -1) * iVar3 + iVar18;
              iVar14 = dims[1] + -1;
              iVar15 = iVar14 * iVar10 + iVar13;
              iVar16 = iVar15 * iVar16;
              *piVar12 = (iVar13 + iVar17) * iVar2 + iVar11;
              piVar12[1] = (iVar17 + iVar8) * iVar2 + iVar11;
              piVar12[2] = iVar16 + iVar9 + 1 + iVar18;
              piVar12[3] = iVar9 + iVar18 + iVar16;
              piVar12[4] = (iVar5 * iVar14 + iVar13) * iVar2 + iVar18;
              piVar12[5] = iVar2 * iVar15 + iVar18;
              piVar12 = piVar12 + 6;
              iVar18 = iVar18 + 1;
              iVar16 = *dims;
              iVar2 = iVar16 + -1;
            } while (iVar18 < iVar2);
          }
          iVar13 = iVar13 + 1;
          iVar8 = iVar8 + 1;
        } while (iVar13 < dims[1] + -1);
      }
      iVar10 = iVar10 + 1;
      iVar5 = iVar5 + 1;
    } while (iVar10 < dims[2] + -1);
  }
  return piVar7;
}

Assistant:

int *
compute_cells(const int *dims, int *ncells) {
  int i,j,k;
  *ncells = (dims[0]-1)*(dims[1]-1)*(dims[2]-1);
  int *cells = (int *)malloc(*ncells * sizeof(int)*6);
  int *cptr = cells;

  int F1 = (dims[0]-1)*(dims[1]-1)*dims[2];     /* back/front */
  int F2 = (dims[0]-1)*(dims[1])  *(dims[2]-1); /* bottom/top */
  // int F3 = (dims[0])  *(dims[1]-1)*(dims[2]-1); /* left/right */

  for(k = 0; k < dims[2]-1; k++)
    for(j = 0; j < dims[1]-1; j++)
      for(i = 0; i < dims[0]-1; i++) {
        int f0 = F1 + k*(dims[0]-1)*dims[1] + j*(dims[0]-1) + i;     /* bottom */
        int f1 = F1 + k*(dims[0]-1)*dims[1] + (j+1)*(dims[0]-1) + i; /* top */
        int f2 = (k+1)*(dims[0]-1)*(dims[1]-1) + j*(dims[0]-1) + i;  /* front */
        int f3 = k*(dims[0]-1)*(dims[1]-1) + j*(dims[0]-1) + i;      /* back  */
        int f4 = F1+F2 + k*dims[0]*(dims[1]-1) + j*dims[0] + i;      /* left */
        int f5 = F1+F2 + k*dims[0]*(dims[1]-1) + j*dims[0] + i+1;    /* right */

        /* This ordering works (see fms.h) */
        *cptr++ = f0;
        *cptr++ = f1;
        *cptr++ = f5;
        *cptr++ = f4;
        *cptr++ = f2;
        *cptr++ = f3;
      }
#ifdef DEBUG_PRINT
  for(i = 0; i < *ncells; i++)
    printf("cell %d: %d %d %d %d %d %d\n", i,
           cells[6*i+0],
           cells[6*i+1],
           cells[6*i+2],
           cells[6*i+3],
           cells[6*i+4],
           cells[6*i+5]
          );
#endif

  return cells;
}